

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void print_help(void)

{
  puts(
      "The Hydrogen Programming Language\nVersion 0.1.0\nHydrogen is a toy programming language by Ben Anderson."
      );
  puts(
      "\nUsage:\n  hydrogen [file] [arguments...]\n\nOptions:\n  --version, -v   Show Hydrogen\'s version number\n  --help, -h      Show this help text\nA REPL is run if no file path is specified."
      );
  return;
}

Assistant:

void print_help() {
	print_version();
	printf(
		"\n"
		"Usage:\n"
		"  hydrogen [file] [arguments...]\n"
		"\n"
		"Options:\n"
		"  --version, -v   Show Hydrogen's version number\n"
		"  --help, -h      Show this help text\n"
		"A REPL is run if no file path is specified.\n"
	);
}